

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O0

longlong game::CountBFS<uttt::IBoard>(int depth)

{
  initializer_list<uttt::IBoard> __l;
  bool bVar1;
  int iVar2;
  int in_EDI;
  IBoard ng;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range4;
  vector<long,_std::allocator<long>_> moves;
  IBoard *g;
  iterator __end0;
  iterator __begin0;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__range3;
  int i;
  int current_level;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> levels [2];
  longlong total;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe88;
  IBoard *in_stack_fffffffffffffe90;
  IBoard *in_stack_fffffffffffffe98;
  IBoard *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffeb8;
  long *plVar3;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec8 [12];
  undefined4 in_stack_fffffffffffffed4;
  IBoard *in_stack_fffffffffffffef8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [24];
  reference local_b0;
  IBoard *local_a8;
  __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  local_a0;
  long *local_98;
  int local_90;
  int local_8c;
  undefined1 local_86;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined8 local_58;
  long *local_50;
  long local_48 [6];
  long local_18;
  int local_c;
  long local_8;
  
  local_18 = 1;
  local_86 = 1;
  local_50 = local_48;
  local_c = in_EDI;
  uttt::IBoard::IBoard(in_stack_fffffffffffffe90);
  local_60 = local_78;
  local_58 = 1;
  std::allocator<uttt::IBoard>::allocator((allocator<uttt::IBoard> *)0x239ddf);
  __l._M_len._4_4_ = in_stack_fffffffffffffed4;
  __l._0_12_ = in_stack_fffffffffffffec8;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            (in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  local_50 = local_48 + 3;
  do {
    plVar3 = local_50;
    memset(local_50,0,0x18);
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)0x239e4d);
    local_50 = plVar3 + 3;
  } while (local_50 != &local_18);
  local_86 = 0;
  std::allocator<uttt::IBoard>::~allocator((allocator<uttt::IBoard> *)0x239e82);
  local_8c = 0;
  for (local_90 = 0; local_90 < local_c; local_90 = local_90 + 1) {
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::clear
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)0x239ece);
    local_98 = local_48 + (long)local_8c * 3;
    local_a0._M_current =
         (IBoard *)
         std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::begin
                   ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffe88
                   );
    local_a8 = (IBoard *)
               std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::end
                         ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                          in_stack_fffffffffffffe88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                               *)in_stack_fffffffffffffe90,
                              (__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                               *)in_stack_fffffffffffffe88), bVar1) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                 ::operator*(&local_a0);
      iVar2 = uttt::IBoard::GetStatus(local_b0);
      if (iVar2 == -1) {
        uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffef8);
        local_d0 = local_c8;
        local_d8._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffe88);
        std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffe88);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffe90,
                                  (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffe88), bVar1) {
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                    (&local_d8);
          in_stack_fffffffffffffef8 = *(IBoard **)local_b0;
          uttt::IBoard::ApplyMove(in_stack_fffffffffffffea0,(IMove *)in_stack_fffffffffffffe98);
          std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::emplace_back<uttt::IBoard&>
                    ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                     in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          local_18 = local_18 + 1;
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&local_d8);
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffea0);
      }
      __gnu_cxx::
      __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>::
      operator++(&local_a0);
    }
    local_8c = 1 - local_8c;
  }
  local_8 = local_18;
  plVar3 = &local_18;
  do {
    plVar3 = plVar3 + -3;
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffea0);
  } while (plVar3 != local_48);
  return local_8;
}

Assistant:

long long
CountBFS(int depth)
{
    long long total = 1;
    std::vector<IGame> levels[2] = {{{}}};
    int current_level = 0;
    for (int i = 0; i < depth; ++i)
    {
        levels[1 - current_level].clear();
        for (const auto &g : levels[current_level])
        {
            if (g.GetStatus() != Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                levels[1 - current_level].emplace_back(ng);
                ++total;
            }
        }
        current_level = 1 - current_level;
    }
    return total;
}